

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<long_double>::MultAdd
          (TPZMatrix<long_double> *this,TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *y,
          TPZFMatrix<long_double> *z,longdouble alpha,longdouble beta,int opt)

{
  long lVar1;
  TPZMatrix<long_double> *pTVar2;
  TPZFMatrix<long_double> *pTVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int64_t iVar10;
  long lVar11;
  longdouble in_ST0;
  longdouble lVar12;
  longdouble lVar13;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble local_a8;
  TPZMatrix<long_double> *local_98;
  long local_90;
  TPZFMatrix<long_double> *local_88;
  longdouble local_7c;
  long local_70;
  int64_t local_68;
  TPZFMatrix<long_double> *local_60;
  longdouble local_54;
  longdouble local_48;
  
  local_7c = alpha;
  if (((opt == 0) &&
      ((this->super_TPZBaseMatrix).fCol !=
       (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow)) ||
     ((this->super_TPZBaseMatrix).fRow != (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow
     )) {
    Error("Operator* <matrices with incompatible dimensions>",(char *)0x0);
  }
  if (((x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol !=
       (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol) ||
     ((x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow !=
      (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow)) {
    Error("TPZFMatrix::MultiplyAdd incompatible dimensions\n",(char *)0x0);
  }
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  iVar10 = (this->super_TPZBaseMatrix).fCol;
  lVar7 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  local_98 = this;
  local_88 = x;
  PrepareZ(this,y,z,beta,opt);
  local_a8 = (longdouble)0;
  if (0 < lVar7) {
    local_90 = 0;
    lVar8 = 0;
    local_70 = lVar7;
    local_68 = iVar10;
    local_60 = z;
    do {
      if (opt == 0) {
        if (0 < iVar10) {
          lVar7 = 0;
          do {
            pTVar2 = local_98;
            if (0 < lVar1) {
              lVar11 = 0;
              lVar9 = 0;
              lVar13 = in_ST1;
              lVar12 = in_ST3;
              lVar4 = in_ST5;
              do {
                in_ST5 = in_ST6;
                in_ST3 = lVar4;
                in_ST1 = lVar12;
                if (((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <= lVar9) ||
                   ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar8)) {
                  TPZFMatrix<long_double>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar12 = *(longdouble *)
                          ((long)z->fElem +
                          lVar11 + (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow *
                                   local_90);
                (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (pTVar2,lVar9,lVar7);
                local_54 = local_7c * in_ST0;
                in_ST0 = in_ST2;
                in_ST2 = in_ST4;
                in_ST4 = in_ST5;
                (*(local_88->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x24])(local_88,lVar7,lVar8);
                local_a8 = lVar12 + local_54 * lVar13;
                in_ST6 = in_ST5;
                (*(z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x23])(z,lVar9,lVar8,&local_a8);
                lVar9 = lVar9 + 1;
                lVar11 = lVar11 + 0x10;
                lVar13 = in_ST1;
                lVar12 = in_ST3;
                lVar4 = in_ST5;
              } while (lVar1 != lVar9);
            }
            lVar7 = lVar7 + 1;
            iVar10 = local_68;
          } while (lVar7 != local_68);
        }
      }
      else if (0 < lVar1) {
        lVar7 = 0;
        do {
          pTVar3 = local_88;
          pTVar2 = local_98;
          local_a8 = (longdouble)0;
          if (0 < iVar10) {
            lVar9 = 0;
            lVar13 = in_ST0;
            lVar12 = in_ST1;
            lVar4 = in_ST2;
            lVar5 = in_ST3;
            lVar6 = in_ST4;
            in_ST4 = in_ST6;
            do {
              in_ST3 = in_ST5;
              in_ST2 = lVar6;
              in_ST1 = lVar5;
              in_ST0 = lVar4;
              (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (pTVar2,lVar9,lVar7);
              (*(pTVar3->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(pTVar3,lVar9,lVar8);
              local_a8 = local_a8 + lVar13 * lVar12;
              lVar9 = lVar9 + 1;
              lVar13 = in_ST0;
              lVar12 = in_ST1;
              lVar4 = in_ST2;
              lVar5 = in_ST3;
              lVar6 = in_ST4;
              in_ST5 = in_ST4;
            } while (iVar10 != lVar9);
          }
          z = local_60;
          local_48 = local_7c * local_a8;
          in_ST6 = in_ST5;
          (*(local_60->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(local_60,lVar7,lVar8,&local_48);
          lVar7 = lVar7 + 1;
        } while (lVar7 != lVar1);
      }
      lVar8 = lVar8 + 1;
      local_90 = local_90 + 0x10;
    } while (lVar8 != local_70);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
	if ((!opt && Cols() != x.Rows()) || Rows() != x.Rows())
		Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	int64_t rows = Rows();
	int64_t cols = Cols();
	int64_t xcols = x.Cols();
	int64_t ic, c, r;
	PrepareZ(y,z,beta,opt);
	TVar val = 0.;
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( c = 0; c<cols; c++) {
				for ( r = 0; r < rows; r++ ) {
					val = z(r,ic) + alpha * GetVal(r,c) * x.GetVal(c,ic);
					z.PutVal(r,ic,val);
				}
			}
		} else {
			for (r = 0; r<rows; r++) {
            	val = 0.;
				for(c = 0; c<cols; c++) {
					val += GetVal(c,r)* x.GetVal(c,ic);
				}
				z.PutVal(r,ic,alpha*val);
			}
		}
	}
}